

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClassType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2)

{
  string_view name;
  ClassType *pCVar1;
  SourceLocation in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pCVar1 = (ClassType *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = in_RSI;
  name._M_len = (size_t)in_RDX;
  ast::ClassType::ClassType((ClassType *)in_RDX[1],(Compilation *)*in_RDX,name,in_RCX);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }